

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

void subBlock(treeNode *tn)

{
  bool bVar1;
  int iVar2;
  treeNode *ptVar3;
  reference pvVar4;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  treeNode *local_e8;
  treeNode *sen_BLOCKt;
  string local_d8 [32];
  treeNode *local_b8;
  treeNode *procedure_BLOCKt;
  string local_a8 [32];
  treeNode *local_88;
  treeNode *var_BLOCKt;
  string local_78 [32];
  treeNode *local_58;
  treeNode *const_BLOCKt;
  int local_48;
  int varcount;
  int tmpCodeAddr;
  allocator local_31;
  string local_30 [32];
  treeNode *local_10;
  treeNode *tn_local;
  
  local_10 = tn;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"jmp",&local_31);
  addCode((string *)local_30,0,-1);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_48 = cx + -1;
  const_BLOCKt._4_4_ = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          sym_abi_cxx11_,"const");
  if (bVar1) {
    ptVar3 = (treeNode *)operator_new(0x38);
    var_BLOCKt._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,anon_var_dwarf_6aaa,(allocator *)((long)&var_BLOCKt + 7));
    treeNode::treeNode(ptVar3,(string *)local_78);
    var_BLOCKt._6_1_ = 0;
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&var_BLOCKt + 7));
    local_58 = ptVar3;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&local_10->child,&local_58);
    const_BLOCK(local_58);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          sym_abi_cxx11_,"var");
  if (bVar1) {
    ptVar3 = (treeNode *)operator_new(0x38);
    procedure_BLOCKt._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,anon_var_dwarf_6ab5,(allocator *)((long)&procedure_BLOCKt + 7));
    treeNode::treeNode(ptVar3,(string *)local_a8);
    procedure_BLOCKt._6_1_ = 0;
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&procedure_BLOCKt + 7));
    local_88 = ptVar3;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&local_10->child,&local_88);
    const_BLOCKt._4_4_ = var_BLOCK(local_88);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          sym_abi_cxx11_,"procedure");
  if (bVar1) {
    ptVar3 = (treeNode *)operator_new(0x38);
    sen_BLOCKt._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,anon_var_dwarf_6ac0,(allocator *)((long)&sen_BLOCKt + 7));
    treeNode::treeNode(ptVar3,(string *)local_d8);
    sen_BLOCKt._6_1_ = 0;
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sen_BLOCKt + 7));
    local_b8 = ptVar3;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&local_10->child,&local_b8);
    procedure_BLOCK(local_b8);
  }
  ptVar3 = (treeNode *)operator_new(0x38);
  local_10a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,anon_var_dwarf_6b66 + 6,&local_109);
  treeNode::treeNode(ptVar3,(string *)local_108);
  local_10a = 0;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  local_e8 = ptVar3;
  std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&local_10->child,&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"int",&local_131);
  addCode((string *)local_130,0,const_BLOCKt._4_4_ + 3);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  iVar2 = cx + -1;
  pvVar4 = std::vector<codeEle,_std::allocator<codeEle>_>::operator[](&codes,(long)local_48);
  pvVar4->offset = iVar2;
  sen_BLOCK(local_e8);
  return;
}

Assistant:

void subBlock(treeNode* tn)
{
    addCode("jmp",0,-1);        //跳转到语句部分
    int tmpCodeAddr = cx - 1;
    int varcount = 0;
    if (sym == "const") {
        auto *const_BLOCKt = new treeNode("常量说明部分");
        tn->child.push_back(const_BLOCKt);
        const_BLOCK(const_BLOCKt);              //常量说明
    }
    if (sym == "var") {
        auto *var_BLOCKt = new treeNode("变量说明部分");
        tn->child.push_back(var_BLOCKt);
        varcount = var_BLOCK(var_BLOCKt);                //变量说明
    }
    if (sym == "procedure") {
        auto *procedure_BLOCKt = new treeNode("过程说明部分");
        tn->child.push_back(procedure_BLOCKt);
        procedure_BLOCK(procedure_BLOCKt);          //过程说明
    }
    auto *sen_BLOCKt = new treeNode("语句");
    tn->child.push_back(sen_BLOCKt);
    //添加代码
    addCode("int",0,varcount+3);
    codes[tmpCodeAddr].offset = cx - 1;
    //
    sen_BLOCK(sen_BLOCKt);                //语句
}